

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Worker::Close(Worker *this)

{
  std::mutex::lock(&this->mutex_);
  this->abort_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  Signaler::Signal(&this->signal_);
  return;
}

Assistant:

void Close() {
            {
                lock_t lock(mutex_);
                abort_ = true;
            }
            Signal();
        }